

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFontGlyph * __thiscall ImFont::FindGlyphNoFallback(ImFont *this,ImWchar c)

{
  ushort uVar1;
  ImFontGlyph *pIVar2;
  undefined2 in_register_00000032;
  
  if ((ulong)CONCAT22(in_register_00000032,c) < (ulong)(long)(this->IndexLookup).Size) {
    uVar1 = (this->IndexLookup).Data[CONCAT22(in_register_00000032,c)];
    pIVar2 = (ImFontGlyph *)0x0;
    if (uVar1 != 0xffff) {
      pIVar2 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    return pIVar2;
  }
  return (ImFontGlyph *)0x0;
}

Assistant:

const ImFontGlyph* ImFont::FindGlyphNoFallback(ImWchar c) const
{
    if (c >= (size_t)IndexLookup.Size)
        return NULL;
    const ImWchar i = IndexLookup.Data[c];
    if (i == (ImWchar)-1)
        return NULL;
    return &Glyphs.Data[i];
}